

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeRecordCompareWithSkip(int nKey1,void *pKey1,UnpackedRecord *pPKey2,int bSkip)

{
  long lVar1;
  KeyInfo *pKVar2;
  byte bVar3;
  u32 uVar4;
  int iVar5;
  uint n;
  i64 iVar6;
  bool local_c9;
  uint local_c8;
  uint local_c0;
  uint local_b8;
  uint local_b0;
  int nCmp_1;
  int nStr;
  int nCmp;
  i64 rhs;
  i64 lhs;
  u32 serial_type;
  u32 s1;
  Mem mem1;
  uchar *aKey1;
  KeyInfo *pKeyInfo;
  Mem *pRhs;
  int rc;
  u32 idx1;
  u32 szHdr1;
  int i;
  u32 d1;
  int bSkip_local;
  UnpackedRecord *pPKey2_local;
  void *pKey1_local;
  int nKey1_local;
  
  pRhs._0_4_ = 0;
  pKeyInfo = (KeyInfo *)pPKey2->aMem;
  mem1.xDel = (_func_void_void_ptr *)pKey1;
  i = bSkip;
  _d1 = pPKey2;
  pPKey2_local = (UnpackedRecord *)pKey1;
  pKey1_local._0_4_ = nKey1;
  if (bSkip == 0) {
    if (*pKey1 < 0x80) {
      rc = (int)*pKey1;
      local_b8 = 1;
    }
    else {
      bVar3 = sqlite3GetVarint32((uchar *)pKey1,(u32 *)&rc);
      local_b8 = (uint)bVar3;
    }
    pRhs._4_4_ = local_b8;
    szHdr1 = rc;
    idx1 = 0;
  }
  else {
    if (*(byte *)((long)pKey1 + 1) < 0x80) {
      lhs._4_4_ = (uint)*(byte *)((long)pKey1 + 1);
      local_b0 = 1;
    }
    else {
      bVar3 = sqlite3GetVarint32((uchar *)((long)pKey1 + 1),(u32 *)((long)&lhs + 4));
      local_b0 = (uint)bVar3;
    }
    pRhs._4_4_ = local_b0 + 1;
    bVar3 = (byte)*mem1.xDel;
    rc = (uint)bVar3;
    uVar4 = sqlite3VdbeSerialTypeLen(lhs._4_4_);
    szHdr1 = bVar3 + uVar4;
    idx1 = 1;
    pKeyInfo = (KeyInfo *)((long)pKeyInfo + 0x38);
  }
  if ((uint)pKey1_local < szHdr1) {
    iVar5 = sqlite3CorruptError(0x13ac7);
    _d1->errCode = (u8)iVar5;
    pKey1_local._4_4_ = 0;
  }
  else {
    do {
      if ((pKeyInfo->nAllField & 4) == 0) {
        if ((pKeyInfo->nAllField & 8) == 0) {
          if ((pKeyInfo->nAllField & 2) == 0) {
            if ((pKeyInfo->nAllField & 0x10) == 0) {
              lhs._0_4_ = (uint)(byte)mem1.xDel[pRhs._4_4_];
              pRhs._0_4_ = (uint)((uint)lhs != 0);
            }
            else {
              if ((byte)mem1.xDel[pRhs._4_4_] < 0x80) {
                lhs._0_4_ = (uint)(byte)mem1.xDel[pRhs._4_4_];
              }
              else {
                sqlite3GetVarint32((uchar *)(mem1.xDel + pRhs._4_4_),(u32 *)&lhs);
              }
              if (((uint)lhs < 0xc) || (((uint)lhs & 1) != 0)) {
                pRhs._0_4_ = 0xffffffff;
              }
              else {
                n = (uint)lhs - 0xc >> 1;
                if ((uint)pKey1_local < szHdr1 + n) {
                  iVar5 = sqlite3CorruptError(0x13b30);
                  _d1->errCode = (u8)iVar5;
                  return 0;
                }
                if ((pKeyInfo->nAllField & 0x4000) == 0) {
                  local_c8 = n;
                  if (*(int *)&pKeyInfo->field_0xc <= (int)n) {
                    local_c8 = *(uint *)&pKeyInfo->field_0xc;
                  }
                  pRhs._0_4_ = memcmp(mem1.xDel + szHdr1,pKeyInfo->db,(long)(int)local_c8);
                  if ((uint)pRhs == 0) {
                    pRhs._0_4_ = n - *(int *)&pKeyInfo->field_0xc;
                  }
                }
                else {
                  iVar5 = isAllZero((char *)(mem1.xDel + szHdr1),n);
                  if (iVar5 == 0) {
                    pRhs._0_4_ = 1;
                  }
                  else {
                    pRhs._0_4_ = n - pKeyInfo->nRef;
                  }
                }
              }
            }
          }
          else {
            if ((byte)mem1.xDel[pRhs._4_4_] < 0x80) {
              lhs._0_4_ = (uint)(byte)mem1.xDel[pRhs._4_4_];
            }
            else {
              sqlite3GetVarint32((uchar *)(mem1.xDel + pRhs._4_4_),(u32 *)&lhs);
            }
            if ((uint)lhs < 0xc) {
              pRhs._0_4_ = 0xffffffff;
            }
            else if (((uint)lhs & 1) == 0) {
              pRhs._0_4_ = 1;
            }
            else {
              mem1.u.i._4_4_ = (uint)lhs - 0xc >> 1;
              if (((uint)pKey1_local < szHdr1 + mem1.u.i._4_4_) ||
                 (pKVar2 = _d1->pKeyInfo, (int)(uint)pKVar2->nAllField <= (int)idx1)) {
                iVar5 = sqlite3CorruptError(0x13b12);
                _d1->errCode = (u8)iVar5;
                return 0;
              }
              if (pKVar2->aColl[(int)idx1] == (CollSeq *)0x0) {
                local_c0 = mem1.u.i._4_4_;
                if (*(int *)&pKeyInfo->field_0xc <= (int)mem1.u.i._4_4_) {
                  local_c0 = *(uint *)&pKeyInfo->field_0xc;
                }
                pRhs._0_4_ = memcmp(mem1.xDel + szHdr1,pKeyInfo->db,(long)(int)local_c0);
                if ((uint)pRhs == 0) {
                  pRhs._0_4_ = mem1.u.i._4_4_ - *(int *)&pKeyInfo->field_0xc;
                }
              }
              else {
                mem1.u.i._2_1_ = pKVar2->enc;
                mem1._32_8_ = pKVar2->db;
                mem1.u.i._0_2_ = 2;
                mem1._8_8_ = mem1.xDel + szHdr1;
                pRhs._0_4_ = vdbeCompareMemString
                                       ((Mem *)&serial_type,(Mem *)pKeyInfo,pKVar2->aColl[(int)idx1]
                                        ,&_d1->errCode);
              }
            }
          }
        }
        else {
          lhs._0_4_ = (uint)(byte)mem1.xDel[pRhs._4_4_];
          if ((uint)lhs < 10) {
            if ((uint)lhs == 0) {
              pRhs._0_4_ = 0xffffffff;
            }
            else {
              sqlite3VdbeSerialGet((uchar *)(mem1.xDel + szHdr1),(uint)lhs,(Mem *)&serial_type);
              if ((uint)lhs == 7) {
                if (*(double *)pKeyInfo <= _serial_type) {
                  if (*(double *)pKeyInfo <= _serial_type && _serial_type != *(double *)pKeyInfo) {
                    pRhs._0_4_ = 1;
                  }
                }
                else {
                  pRhs._0_4_ = 0xffffffff;
                }
              }
              else {
                pRhs._0_4_ = sqlite3IntFloatCompare(_serial_type,*(double *)pKeyInfo);
              }
            }
          }
          else {
            pRhs._0_4_ = 1;
          }
        }
      }
      else {
        lhs._0_4_ = (uint)(byte)mem1.xDel[pRhs._4_4_];
        if ((uint)lhs < 10) {
          if ((uint)lhs == 0) {
            pRhs._0_4_ = 0xffffffff;
          }
          else if ((uint)lhs == 7) {
            sqlite3VdbeSerialGet((uchar *)(mem1.xDel + szHdr1),7,(Mem *)&serial_type);
            iVar6._0_4_ = pKeyInfo->nRef;
            iVar6._4_1_ = pKeyInfo->enc;
            iVar6._5_1_ = pKeyInfo->field_0x5;
            iVar6._6_2_ = pKeyInfo->nKeyField;
            iVar5 = sqlite3IntFloatCompare(iVar6,_serial_type);
            pRhs._0_4_ = -iVar5;
          }
          else {
            iVar6 = vdbeRecordDecodeInt((uint)lhs,(u8 *)(mem1.xDel + szHdr1));
            lVar1._0_4_ = pKeyInfo->nRef;
            lVar1._4_1_ = pKeyInfo->enc;
            lVar1._5_1_ = pKeyInfo->field_0x5;
            lVar1._6_2_ = pKeyInfo->nKeyField;
            if (iVar6 < lVar1) {
              pRhs._0_4_ = 0xffffffff;
            }
            else if (lVar1 < iVar6) {
              pRhs._0_4_ = 1;
            }
          }
        }
        else {
          pRhs._0_4_ = 1;
        }
      }
      if ((uint)pRhs != 0) {
        if (_d1->pKeyInfo->aSortOrder[(int)idx1] != '\0') {
          pRhs._0_4_ = -(uint)pRhs;
        }
        return (uint)pRhs;
      }
      idx1 = idx1 + 1;
      if (idx1 == _d1->nField) break;
      pKeyInfo = (KeyInfo *)&pKeyInfo[1].db;
      uVar4 = sqlite3VdbeSerialTypeLen((uint)lhs);
      szHdr1 = uVar4 + szHdr1;
      iVar5 = sqlite3VarintLen((ulong)(uint)lhs);
      pRhs._4_4_ = iVar5 + pRhs._4_4_;
      local_c9 = pRhs._4_4_ < (uint)rc && szHdr1 <= (uint)pKey1_local;
    } while (local_c9);
    _d1->eqSeen = '\x01';
    pKey1_local._4_4_ = (int)_d1->default_rc;
  }
  return pKey1_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeRecordCompareWithSkip(
  int nKey1, const void *pKey1,   /* Left key */
  UnpackedRecord *pPKey2,         /* Right key */
  int bSkip                       /* If true, skip the first field */
){
  u32 d1;                         /* Offset into aKey[] of next data element */
  int i;                          /* Index of next field to compare */
  u32 szHdr1;                     /* Size of record header in bytes */
  u32 idx1;                       /* Offset of first type in header */
  int rc = 0;                     /* Return value */
  Mem *pRhs = pPKey2->aMem;       /* Next field of pPKey2 to compare */
  KeyInfo *pKeyInfo;
  const unsigned char *aKey1 = (const unsigned char *)pKey1;
  Mem mem1;

  /* If bSkip is true, then the caller has already determined that the first
  ** two elements in the keys are equal. Fix the various stack variables so
  ** that this routine begins comparing at the second field. */
  if( bSkip ){
    u32 s1;
    idx1 = 1 + getVarint32(&aKey1[1], s1);
    szHdr1 = aKey1[0];
    d1 = szHdr1 + sqlite3VdbeSerialTypeLen(s1);
    i = 1;
    pRhs++;
  }else{
    idx1 = getVarint32(aKey1, szHdr1);
    d1 = szHdr1;
    i = 0;
  }
  if( d1>(unsigned)nKey1 ){ 
    pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
    return 0;  /* Corruption */
  }

  VVA_ONLY( mem1.szMalloc = 0; ) /* Only needed by assert() statements */
  assert( pPKey2->pKeyInfo->nAllField>=pPKey2->nField 
       || CORRUPT_DB );
  assert( pPKey2->pKeyInfo->aSortOrder!=0 );
  assert( pPKey2->pKeyInfo->nKeyField>0 );
  assert( idx1<=szHdr1 || CORRUPT_DB );
  do{
    u32 serial_type;

    /* RHS is an integer */
    if( pRhs->flags & MEM_Int ){
      serial_type = aKey1[idx1];
      testcase( serial_type==12 );
      if( serial_type>=10 ){
        rc = +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else if( serial_type==7 ){
        sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
        rc = -sqlite3IntFloatCompare(pRhs->u.i, mem1.u.r);
      }else{
        i64 lhs = vdbeRecordDecodeInt(serial_type, &aKey1[d1]);
        i64 rhs = pRhs->u.i;
        if( lhs<rhs ){
          rc = -1;
        }else if( lhs>rhs ){
          rc = +1;
        }
      }
    }

    /* RHS is real */
    else if( pRhs->flags & MEM_Real ){
      serial_type = aKey1[idx1];
      if( serial_type>=10 ){
        /* Serial types 12 or greater are strings and blobs (greater than
        ** numbers). Types 10 and 11 are currently "reserved for future 
        ** use", so it doesn't really matter what the results of comparing
        ** them to numberic values are.  */
        rc = +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else{
        sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
        if( serial_type==7 ){
          if( mem1.u.r<pRhs->u.r ){
            rc = -1;
          }else if( mem1.u.r>pRhs->u.r ){
            rc = +1;
          }
        }else{
          rc = sqlite3IntFloatCompare(mem1.u.i, pRhs->u.r);
        }
      }
    }

    /* RHS is a string */
    else if( pRhs->flags & MEM_Str ){
      getVarint32(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 ){
        rc = -1;
      }else if( !(serial_type & 0x01) ){
        rc = +1;
      }else{
        mem1.n = (serial_type - 12) / 2;
        testcase( (d1+mem1.n)==(unsigned)nKey1 );
        testcase( (d1+mem1.n+1)==(unsigned)nKey1 );
        if( (d1+mem1.n) > (unsigned)nKey1
         || (pKeyInfo = pPKey2->pKeyInfo)->nAllField<=i
        ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pKeyInfo->aColl[i] ){
          mem1.enc = pKeyInfo->enc;
          mem1.db = pKeyInfo->db;
          mem1.flags = MEM_Str;
          mem1.z = (char*)&aKey1[d1];
          rc = vdbeCompareMemString(
              &mem1, pRhs, pKeyInfo->aColl[i], &pPKey2->errCode
          );
        }else{
          int nCmp = MIN(mem1.n, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = mem1.n - pRhs->n; 
        }
      }
    }

    /* RHS is a blob */
    else if( pRhs->flags & MEM_Blob ){
      assert( (pRhs->flags & MEM_Zero)==0 || pRhs->n==0 );
      getVarint32(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 || (serial_type & 0x01) ){
        rc = -1;
      }else{
        int nStr = (serial_type - 12) / 2;
        testcase( (d1+nStr)==(unsigned)nKey1 );
        testcase( (d1+nStr+1)==(unsigned)nKey1 );
        if( (d1+nStr) > (unsigned)nKey1 ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pRhs->flags & MEM_Zero ){
          if( !isAllZero((const char*)&aKey1[d1],nStr) ){
            rc = 1;
          }else{
            rc = nStr - pRhs->u.nZero;
          }
        }else{
          int nCmp = MIN(nStr, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = nStr - pRhs->n;
        }
      }
    }

    /* RHS is null */
    else{
      serial_type = aKey1[idx1];
      rc = (serial_type!=0);
    }

    if( rc!=0 ){
      if( pPKey2->pKeyInfo->aSortOrder[i] ){
        rc = -rc;
      }
      assert( vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, rc) );
      assert( mem1.szMalloc==0 );  /* See comment below */
      return rc;
    }

    i++;
    if( i==pPKey2->nField ) break;
    pRhs++;
    d1 += sqlite3VdbeSerialTypeLen(serial_type);
    idx1 += sqlite3VarintLen(serial_type);
  }while( idx1<(unsigned)szHdr1 && d1<=(unsigned)nKey1 );

  /* No memory allocation is ever used on mem1.  Prove this using
  ** the following assert().  If the assert() fails, it indicates a
  ** memory leak and a need to call sqlite3VdbeMemRelease(&mem1).  */
  assert( mem1.szMalloc==0 );

  /* rc==0 here means that one or both of the keys ran out of fields and
  ** all the fields up to that point were equal. Return the default_rc
  ** value.  */
  assert( CORRUPT_DB 
       || vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, pPKey2->default_rc) 
       || pPKey2->pKeyInfo->db->mallocFailed
  );
  pPKey2->eqSeen = 1;
  return pPKey2->default_rc;
}